

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

void __thiscall SpotLight_Sampling_Test::TestBody(SpotLight_Sampling_Test *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Allocator alloc;
  LightLeSample *pLVar4;
  LightLeSample *pLVar5;
  long lVar6;
  char *pcVar7;
  char *in_R9;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar14 [64];
  SampledSpectrum SVar15;
  AssertionResult gtest_ar_;
  AssertHelper local_2d8;
  AssertHelper local_2d0;
  AssertionResult gtest_ar;
  float local_2a8;
  SpectrumHandle local_270;
  RNG rng;
  SampledWavelengths lambda;
  optional<pbrt::LightLeSample> ls;
  SpotLight light;
  Transform id;
  undefined1 extraout_var [60];
  
  if ((TestBody()::I == '\0') && (iVar8 = __cxa_guard_acquire(&TestBody()::I), iVar8 != 0)) {
    TestBody::I.c = 10.0;
    __cxa_guard_release(&TestBody()::I);
  }
  pbrt::SampledWavelengths::SampleUniform(&lambda,0.5,360.0,830.0);
  pbrt::Transform::Transform(&id);
  lVar6 = 0;
  do {
    if (lVar6 == 0x20) {
      return;
    }
    ls.optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0;
    ls.optionalValue._8_8_ = 0;
    local_270.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )0x1000002f327e8;
    iVar8 = *(int *)((long)&DAT_00522980 + lVar6);
    iVar1 = *(int *)((long)&DAT_00522984 + lVar6);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SpotLight::SpotLight
              (&light,&id,(MediumInterface *)&ls,&local_270,1.0,(float)iVar8,(float)iVar1,alloc);
    rng.state = 0x853c49e6748fea9b;
    rng.inc = 0xda3e39cb94b95bdb;
    iVar8 = 100;
    while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      fVar11 = pbrt::RNG::Uniform<float>(&rng);
      fVar12 = pbrt::RNG::Uniform<float>(&rng);
      fVar13 = pbrt::RNG::Uniform<float>(&rng);
      auVar14._0_4_ = pbrt::RNG::Uniform<float>(&rng);
      auVar14._4_60_ = extraout_var;
      auVar10._4_4_ = extraout_XMM0_Db;
      auVar10._0_4_ = fVar11;
      auVar10._8_4_ = extraout_XMM0_Dc;
      auVar10._12_4_ = extraout_XMM0_Dd;
      auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar12),0x10);
      auVar2._4_4_ = extraout_XMM0_Db_00;
      auVar2._0_4_ = fVar13;
      auVar2._8_4_ = extraout_XMM0_Dc_00;
      auVar2._12_4_ = extraout_XMM0_Dd_00;
      auVar2 = vinsertps_avx(auVar2,auVar14._0_16_,0x10);
      pbrt::SpotLight::SampleLe(&ls,&light,(Point2f)auVar10._0_8_,(Point2f)auVar2._0_8_,&lambda,0.0)
      ;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (ls.set == false) {
        testing::Message::Message((Message *)&local_2d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"ls.has_value()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x3d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_2d8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      pLVar4 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      if ((((pLVar4->ray).o.super_Tuple3<pbrt::Point3,_float>.x != 0.0) ||
          (fVar11 = (pLVar4->ray).o.super_Tuple3<pbrt::Point3,_float>.y, fVar11 != 0.0)) ||
         (NAN(fVar11))) {
        gtest_ar_._0_8_ = (ulong)(uint7)gtest_ar_._1_7_ << 8;
LAB_002de05c:
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)&local_2d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"ls->ray.o == Point3f(0, 0, 0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x3e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2d8);
        testing::internal::AssertHelper::~AssertHelper(&local_2d0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_2d8);
      }
      else {
        fVar11 = (pLVar4->ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = fVar11 == 0.0;
        if ((fVar11 != 0.0) || (NAN(fVar11))) goto LAB_002de05c;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 1;
      pLVar4 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      testing::internal::CmpHelperEQ<int,float>
                ((internal *)&gtest_ar,"1","ls->pdfPos",(int *)&gtest_ar_,&pLVar4->pdfPos);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x3f,pcVar7);
        testing::internal::AssertHelper::operator=(&local_2d8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_2d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      SVar15 = pbrt::SpotLight::Phi(&light,&lambda);
      local_2a8 = SVar15.values.values[0];
      pLVar4 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      pLVar5 = pstd::optional<pbrt::LightLeSample>::value(&ls);
      SVar15 = pbrt::SampledSpectrum::operator/(&pLVar4->L,pLVar5->pdfDir);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f50624dd2f1a9;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(local_2a8 - SVar15.values.values[0])),auVar3);
      local_2d8.data_._0_4_ = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(light.Phi(lambda)[0] - (ls->L / ls->pdfDir)[0])",
                 "1e-3",(float *)&local_2d8,(double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
                   ,0x42,pcVar7);
        testing::internal::AssertHelper::operator=(&local_2d8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_2d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pstd::optional<pbrt::LightLeSample>::~optional(&ls);
    }
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&light.Iemit.values);
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

TEST(SpotLight, Sampling) {
    static ConstantSpectrum I(10.);
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);

    int widthStart[][2] = {{50, 0}, {40, 10}, {60, 5}, {70, 70}};
    Transform id;
    for (auto ws : widthStart) {
        SpotLight light(id, MediumInterface(), &I, 1.f /* scale */,
                        ws[0] /* total width */, ws[1] /* falloff start */,
                        Allocator());

        RNG rng;
        for (int i = 0; i < 100; ++i) {
            Point2f u1{rng.Uniform<Float>(), rng.Uniform<Float>()};
            Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
            pstd::optional<LightLeSample> ls =
                light.SampleLe(u1, u2, lambda, 0 /* time */);
            EXPECT_TRUE(ls.has_value());
            EXPECT_TRUE(ls->ray.o == Point3f(0, 0, 0));
            EXPECT_EQ(1, ls->pdfPos);
            // Importance should be perfect, so a single sample should
            // compute power with zero variance.
            EXPECT_LT(std::abs(light.Phi(lambda)[0] - (ls->L / ls->pdfDir)[0]), 1e-3);
        }
    }
}